

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O0

void ncnn::pack_A_tile(Mat *A,Mat *AT,int batch,int max_ii,int max_kk)

{
  int iVar1;
  int local_a4;
  undefined4 *local_a0;
  int local_94;
  undefined4 *local_90;
  int local_84;
  undefined4 *puStack_80;
  int kk_3;
  float *p0_3;
  undefined4 *puStack_70;
  int kk_2;
  float *p0_2;
  undefined4 *puStack_60;
  int kk_1;
  float *p0_1;
  int kk;
  float *p0;
  int ii;
  float *pp;
  int b;
  int N;
  int max_kk_local;
  int max_ii_local;
  int batch_local;
  Mat *AT_local;
  Mat *A_local;
  
  iVar1 = max_kk * batch;
  for (p0_1._4_4_ = 0; p0_1._4_4_ < batch; p0_1._4_4_ = p0_1._4_4_ + 1) {
    puStack_60 = (undefined4 *)((long)AT->data + (long)AT->w * (long)p0_1._4_4_ * AT->elemsize);
    for (p0_2._4_4_ = 0; p0_2._4_4_ + 7 < max_ii; p0_2._4_4_ = p0_2._4_4_ + 8) {
      puStack_70 = (undefined4 *)
                   ((long)A->data + (long)p0_1._4_4_ * 4 + (long)(p0_2._4_4_ * iVar1) * 4);
      for (p0_3._4_4_ = 0; p0_3._4_4_ < max_kk; p0_3._4_4_ = p0_3._4_4_ + 1) {
        *puStack_60 = *puStack_70;
        puStack_60[1] = puStack_70[iVar1];
        puStack_60[2] = puStack_70[iVar1 * 2];
        puStack_60[3] = puStack_70[iVar1 * 3];
        puStack_60[4] = puStack_70[iVar1 * 4];
        puStack_60[5] = puStack_70[iVar1 * 5];
        puStack_60[6] = puStack_70[iVar1 * 6];
        puStack_60[7] = puStack_70[iVar1 * 7];
        puStack_70 = puStack_70 + batch;
        puStack_60 = puStack_60 + 8;
      }
    }
    for (; p0_2._4_4_ + 3 < max_ii; p0_2._4_4_ = p0_2._4_4_ + 4) {
      puStack_80 = (undefined4 *)
                   ((long)A->data + (long)p0_1._4_4_ * 4 + (long)(p0_2._4_4_ * iVar1) * 4);
      for (local_84 = 0; local_84 < max_kk; local_84 = local_84 + 1) {
        *puStack_60 = *puStack_80;
        puStack_60[1] = puStack_80[iVar1];
        puStack_60[2] = puStack_80[iVar1 * 2];
        puStack_60[3] = puStack_80[iVar1 * 3];
        puStack_80 = puStack_80 + batch;
        puStack_60 = puStack_60 + 4;
      }
    }
    for (; p0_2._4_4_ + 1 < max_ii; p0_2._4_4_ = p0_2._4_4_ + 2) {
      local_90 = (undefined4 *)
                 ((long)A->data + (long)p0_1._4_4_ * 4 + (long)(p0_2._4_4_ * iVar1) * 4);
      for (local_94 = 0; local_94 < max_kk; local_94 = local_94 + 1) {
        *puStack_60 = *local_90;
        puStack_60[1] = local_90[iVar1];
        local_90 = local_90 + batch;
        puStack_60 = puStack_60 + 2;
      }
    }
    for (; p0_2._4_4_ < max_ii; p0_2._4_4_ = p0_2._4_4_ + 1) {
      local_a0 = (undefined4 *)
                 ((long)A->data + (long)p0_1._4_4_ * 4 + (long)(p0_2._4_4_ * iVar1) * 4);
      for (local_a4 = 0; local_a4 < max_kk; local_a4 = local_a4 + 1) {
        *puStack_60 = *local_a0;
        local_a0 = local_a0 + batch;
        puStack_60 = puStack_60 + 1;
      }
    }
  }
  return;
}

Assistant:

static void pack_A_tile(const Mat& A, Mat& AT, int batch, int max_ii, int max_kk)
{
    const int N = max_kk * batch;

    for (int b = 0; b < batch; b++)
    {
        float* pp = AT.row(b);

        int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; ii + 15 < max_ii; ii += 16)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                pp[4] = p0[4 * N];
                pp[5] = p0[5 * N];
                pp[6] = p0[6 * N];
                pp[7] = p0[7 * N];
                pp[8] = p0[8 * N];
                pp[9] = p0[9 * N];
                pp[10] = p0[10 * N];
                pp[11] = p0[11 * N];
                pp[12] = p0[12 * N];
                pp[13] = p0[13 * N];
                pp[14] = p0[14 * N];
                pp[15] = p0[15 * N];
                p0 += batch;
                pp += 16;
            }
        }
#endif // __AVX512F__
        for (; ii + 7 < max_ii; ii += 8)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                pp[4] = p0[4 * N];
                pp[5] = p0[5 * N];
                pp[6] = p0[6 * N];
                pp[7] = p0[7 * N];
                p0 += batch;
                pp += 8;
            }
        }
#endif // __AVX__
        for (; ii + 3 < max_ii; ii += 4)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                p0 += batch;
                pp += 4;
            }
        }
#endif // __SSE2__
        for (; ii + 1 < max_ii; ii += 2)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                p0 += batch;
                pp += 2;
            }
        }
        for (; ii < max_ii; ii++)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                p0 += batch;
                pp += 1;
            }
        }
    }
}